

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O2

int get_value_end_of(Am_Object *obj,Am_Slot_Key slot)

{
  char cVar1;
  int iVar2;
  Am_Value *pAVar3;
  undefined6 in_register_00000032;
  Am_Object other_obj;
  Am_Value v;
  
  v.type = 0;
  v.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)obj,CONCAT62(in_register_00000032,slot));
  Am_Value::operator=(&v,pAVar3);
  cVar1 = Am_Value::Valid();
  if (cVar1 == '\0') {
    iVar2 = -1;
  }
  else {
    Am_Object::Am_Object(&other_obj,&v);
    pAVar3 = (Am_Value *)Am_Object::Get((ushort)&other_obj,0x169);
    iVar2 = Am_Value::operator_cast_to_int(pAVar3);
    Am_Object::~Am_Object(&other_obj);
  }
  Am_Value::~Am_Value(&v);
  return iVar2;
}

Assistant:

Am_Define_Formula(int, and_value) {
  int v1 = get_value_end_of(self, INPUT_1);
  int v2 = get_value_end_of(self, INPUT_2);
  if (v1 >=0 && v2 >= 0)
    return v1 & v2;
  else return -1;
}